

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softfloat.c
# Opt level: O3

float128 float32_to_float128_arm(float32 a,float_status *status)

{
  undefined1 auVar1 [16];
  ulong uVar2;
  uint uVar3;
  ulong uVar4;
  uint uVar5;
  
  if ((status->flush_inputs_to_zero != '\0') && ((a & 0x7fffff) != 0 && (a & 0x7f800000) == 0)) {
    status->float_exception_flags = status->float_exception_flags | 0x40;
    a = a & 0x80000000;
  }
  uVar5 = a & 0x7fffff;
  uVar2 = (ulong)(a >> 0x1f);
  if ((char)(a >> 0x17) == '\0') {
    if (uVar5 == 0) {
      uVar4 = uVar2 << 0x3f;
      goto LAB_00554cdb;
    }
    uVar3 = 0x1f;
    if (uVar5 != 0) {
      for (; uVar5 >> uVar3 == 0; uVar3 = uVar3 - 1) {
      }
    }
    uVar5 = uVar5 << ((char)(uVar3 ^ 0x1f) - 8U & 0x1f);
    uVar3 = 8 - (uVar3 ^ 0x1f);
  }
  else {
    uVar3 = a >> 0x17 & 0xff;
    if (uVar3 == 0xff) {
      if (uVar5 == 0) {
        uVar4 = uVar2 << 0x3f | 0x7fff000000000000;
      }
      else {
        if ((a & 0x3fffff) != 0 && (a & 0x7fc00000) == 0x7f800000) {
          status->float_exception_flags = status->float_exception_flags | 1;
        }
        uVar4 = 0x7fff800000000000;
        if (status->default_nan_mode == '\0') {
          uVar4 = uVar2 << 0x3f | (ulong)a << 0x19 | 0x7fff000000000000;
        }
      }
      goto LAB_00554cdb;
    }
  }
  uVar4 = ((ulong)(uVar3 + 0x3f80) << 0x30) + (uVar2 << 0x3f | (ulong)uVar5 << 0x19);
LAB_00554cdb:
  auVar1._8_8_ = 0;
  auVar1._0_8_ = uVar4;
  return (float128)(auVar1 << 0x40);
}

Assistant:

float32 float32_squash_input_denormal(float32 a, float_status *status)
{
    if (status->flush_inputs_to_zero) {
        FloatParts p = float32_unpack_raw(a);
        if (parts_squash_denormal(p, status)) {
            return float32_set_sign(float32_zero, p.sign);
        }
    }
    return a;
}